

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O3

void zsummer::log4z::FixPath(string *path)

{
  _Alloc_hider _Var1;
  int iVar2;
  FILE *__stream;
  iterator iVar3;
  ostream *poVar4;
  long *plVar5;
  long lVar6;
  char *pcVar7;
  size_type sVar8;
  size_type sVar9;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>>
  *this;
  char *pcVar10;
  int iVar11;
  string sStack_3e8;
  string sStack_3c8;
  key_type kStack_3a8;
  string sStack_388;
  _Base_ptr p_Stack_368;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>
  pStack_360;
  LoggerInfo LStack_2b8;
  char acStack_230 [504];
  
  sVar9 = path->_M_string_length;
  if (sVar9 != 0) {
    pcVar10 = (path->_M_dataplus)._M_p;
    pcVar7 = pcVar10;
    do {
      if (*pcVar7 == '\\') {
        *pcVar7 = '/';
        pcVar10 = (path->_M_dataplus)._M_p;
        sVar9 = path->_M_string_length;
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != pcVar10 + sVar9);
    this = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>>
            *)(sVar9 - 1);
    if (sVar9 == 0) {
      pcVar10 = "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)";
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",this,0);
      __stream = fopen(pcVar10,"r");
      if (__stream != (FILE *)0x0) {
        kStack_3a8._M_dataplus._M_p = (pointer)&kStack_3a8.field_2;
        iVar11 = 0;
        kStack_3a8._M_string_length = 0;
        kStack_3a8.field_2._M_local_buf[0] = '\0';
        sStack_3e8._M_dataplus._M_p = (pointer)&sStack_3e8.field_2;
        sStack_3e8._M_string_length = 0;
        sStack_3e8.field_2._M_local_buf[0] = '\0';
        sStack_388._M_dataplus._M_p = (pointer)&sStack_388.field_2;
        sStack_388._M_string_length = 0;
        sStack_388.field_2._M_local_buf[0] = '\0';
        sStack_3c8._M_dataplus._M_p = (pointer)&sStack_3c8.field_2;
        sStack_3c8._M_string_length = 0;
        sStack_3c8.field_2._M_local_buf[0] = '\0';
        memset(acStack_230,0,500);
        pcVar10 = fgets(acStack_230,499,__stream);
        if (pcVar10 != (char *)0x0) {
          p_Stack_368 = (_Base_ptr)(this + 8);
          do {
            sVar9 = sStack_3e8._M_string_length;
            strlen(acStack_230);
            std::__cxx11::string::_M_replace((ulong)&sStack_3e8,0,(char *)sVar9,(ulong)acStack_230);
            TrimLogConfig(&sStack_3e8,'\0');
            iVar11 = iVar11 + 1;
            if (((char *)sStack_3e8._M_string_length != (char *)0x0) &&
               (*sStack_3e8._M_dataplus._M_p != '#')) {
              if (*sStack_3e8._M_dataplus._M_p == '[') {
                TrimLogConfig(&sStack_3e8,'[');
                TrimLogConfig(&sStack_3e8,']');
                std::__cxx11::string::_M_assign((string *)&kStack_3a8);
                pStack_360.first._M_dataplus._M_p = (pointer)&pStack_360.first.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&pStack_360,sStack_3e8._M_dataplus._M_p,
                           (char *)(sStack_3e8._M_string_length + (long)sStack_3e8._M_dataplus._M_p)
                          );
                sVar9 = pStack_360.first._M_string_length;
                _Var1._M_p = pStack_360.first._M_dataplus._M_p;
                if (pStack_360.first._M_string_length != 0) {
                  sVar8 = 0;
                  do {
                    iVar2 = tolower((int)_Var1._M_p[sVar8]);
                    _Var1._M_p[sVar8] = (char)iVar2;
                    sVar8 = sVar8 + 1;
                  } while (sVar9 != sVar8);
                }
                iVar2 = std::__cxx11::string::compare((char *)&pStack_360);
                if (iVar2 == 0) {
                  std::__cxx11::string::_M_replace
                            ((ulong)&kStack_3a8,0,(char *)kStack_3a8._M_string_length,0x1317de);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pStack_360.first._M_dataplus._M_p != &pStack_360.first.field_2) {
                  operator_delete(pStack_360.first._M_dataplus._M_p,
                                  pStack_360.first.field_2._M_allocated_capacity + 1);
                }
                iVar3 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                                *)this,&kStack_3a8);
                if (iVar3._M_node == p_Stack_368) {
                  LoggerInfo::LoggerInfo(&LStack_2b8);
                  std::__cxx11::string::_M_replace
                            ((ulong)&LStack_2b8._path,0,(char *)LStack_2b8._path._M_string_length,
                             0x1317e3);
                  LStack_2b8._level = 0;
                  LStack_2b8._display = true;
                  LStack_2b8._monthdir = false;
                  LStack_2b8._enable = false;
                  LStack_2b8._limitsize = 100;
                  std::__cxx11::string::_M_assign((string *)&LStack_2b8);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>
                  ::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_zsummer::log4z::LoggerInfo_&,_true>
                            (&pStack_360,&LStack_2b8._name,&LStack_2b8);
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>>
                  ::_M_emplace_unique<std::pair<std::__cxx11::string,zsummer::log4z::LoggerInfo>>
                            (this,&pStack_360);
                  if ((FILE *)pStack_360.second._handle.m_file != (FILE *)0x0) {
                    fclose((FILE *)pStack_360.second._handle.m_file);
                    pStack_360.second._handle.m_file = (FILE *)0x0;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pStack_360.second._path._M_dataplus._M_p !=
                      &pStack_360.second._path.field_2) {
                    operator_delete(pStack_360.second._path._M_dataplus._M_p,
                                    pStack_360.second._path.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pStack_360.second._pid._M_dataplus._M_p != &pStack_360.second._pid.field_2)
                  {
                    operator_delete(pStack_360.second._pid._M_dataplus._M_p,
                                    pStack_360.second._pid.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pStack_360.second._name._M_dataplus._M_p !=
                      &pStack_360.second._name.field_2) {
                    operator_delete(pStack_360.second._name._M_dataplus._M_p,
                                    pStack_360.second._name.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pStack_360.first._M_dataplus._M_p != &pStack_360.first.field_2) {
                    operator_delete(pStack_360.first._M_dataplus._M_p,
                                    pStack_360.first.field_2._M_allocated_capacity + 1);
                  }
                  if ((FILE *)LStack_2b8._handle.m_file != (FILE *)0x0) {
                    fclose((FILE *)LStack_2b8._handle.m_file);
                    LStack_2b8._handle.m_file = (FILE *)0x0;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)LStack_2b8._path._M_dataplus._M_p != &LStack_2b8._path.field_2) {
                    operator_delete(LStack_2b8._path._M_dataplus._M_p,
                                    LStack_2b8._path.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)LStack_2b8._pid._M_dataplus._M_p != &LStack_2b8._pid.field_2) {
                    operator_delete(LStack_2b8._pid._M_dataplus._M_p,
                                    LStack_2b8._pid.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)LStack_2b8._name._M_dataplus._M_p != &LStack_2b8._name.field_2) {
                    operator_delete(LStack_2b8._name._M_dataplus._M_p,
                                    LStack_2b8._name.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "log4z configure warning: dumplicate logger name:[",0x31);
                  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cout,kStack_3a8._M_dataplus._M_p,
                                      kStack_3a8._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] at line:",10);
                  plVar5 = (long *)std::ostream::operator<<(poVar4,iVar11);
                  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
                  std::ostream::put((char)plVar5);
                  std::ostream::flush();
                }
              }
              else {
                lVar6 = std::__cxx11::string::find((char)&sStack_3e8,0x3d);
                if (lVar6 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"log4z configure warning: unresolved line:[",0x2a
                            );
                  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cout,sStack_3e8._M_dataplus._M_p,
                                      sStack_3e8._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] at line:",10);
                  plVar5 = (long *)std::ostream::operator<<(poVar4,iVar11);
                  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
                  std::ostream::put((char)plVar5);
                  std::ostream::flush();
                }
                else {
                  std::__cxx11::string::substr((ulong)&pStack_360,(ulong)&sStack_3e8);
                  std::__cxx11::string::operator=((string *)&sStack_388,(string *)&pStack_360);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pStack_360.first._M_dataplus._M_p != &pStack_360.first.field_2) {
                    operator_delete(pStack_360.first._M_dataplus._M_p,
                                    pStack_360.first.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::string::substr((ulong)&pStack_360,(ulong)&sStack_3e8);
                  std::__cxx11::string::operator=((string *)&sStack_3c8,(string *)&pStack_360);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pStack_360.first._M_dataplus._M_p != &pStack_360.first.field_2) {
                    operator_delete(pStack_360.first._M_dataplus._M_p,
                                    pStack_360.first.field_2._M_allocated_capacity + 1);
                  }
                  TrimLogConfig(&sStack_388,'\0');
                  TrimLogConfig(&sStack_3c8,'\0');
                  iVar3 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                                  *)this,&kStack_3a8);
                  sVar9 = sStack_388._M_string_length;
                  _Var1._M_p = sStack_388._M_dataplus._M_p;
                  if (iVar3._M_node == p_Stack_368) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "log4z configure warning: not found current logger name:[",0x38);
                    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,kStack_3a8._M_dataplus._M_p,
                                        kStack_3a8._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] at line:",10);
                    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar11);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", key=",6);
                    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar4,sStack_388._M_dataplus._M_p,
                                        sStack_388._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", value=",8);
                    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar4,sStack_3c8._M_dataplus._M_p,
                                        sStack_3c8._M_string_length);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                    std::ostream::put((char)poVar4);
                    std::ostream::flush();
                  }
                  else {
                    if (sStack_388._M_string_length != 0) {
                      sVar8 = 0;
                      do {
                        iVar2 = tolower((int)_Var1._M_p[sVar8]);
                        _Var1._M_p[sVar8] = (char)iVar2;
                        sVar8 = sVar8 + 1;
                      } while (sVar9 != sVar8);
                    }
                    iVar2 = std::__cxx11::string::compare((char *)&sStack_388);
                    sVar9 = sStack_3c8._M_string_length;
                    _Var1._M_p = sStack_3c8._M_dataplus._M_p;
                    if (iVar2 == 0) {
                      std::__cxx11::string::_M_assign((string *)(iVar3._M_node + 4));
                    }
                    else {
                      if (sStack_3c8._M_string_length != 0) {
                        sVar8 = 0;
                        do {
                          iVar2 = tolower((int)_Var1._M_p[sVar8]);
                          _Var1._M_p[sVar8] = (char)iVar2;
                          sVar8 = sVar8 + 1;
                        } while (sVar9 != sVar8);
                      }
                      iVar2 = std::__cxx11::string::compare((char *)&sStack_388);
                      if (iVar2 == 0) {
                        iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8);
                        if ((iVar2 == 0) ||
                           (iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8), iVar2 == 0))
                        {
                          iVar3._M_node[5]._M_color = _S_red;
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8);
                          if (iVar2 == 0) {
                            iVar3._M_node[5]._M_color = _S_black;
                          }
                          else {
                            iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8);
                            if ((iVar2 == 0) ||
                               (iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8),
                               iVar2 == 0)) {
LAB_0011d0d0:
                              iVar3._M_node[5]._M_color = 2;
                            }
                            else {
                              iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8);
                              if (iVar2 == 0) {
                                iVar3._M_node[5]._M_color = 3;
                              }
                              else {
                                iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8);
                                if (iVar2 == 0) goto LAB_0011d0d0;
                                iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8);
                                if (iVar2 == 0) {
                                  iVar3._M_node[5]._M_color = 5;
                                }
                              }
                            }
                          }
                        }
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare((char *)&sStack_388);
                        if (iVar2 == 0) {
                          iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8);
                          if ((iVar2 == 0) ||
                             (iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8), iVar2 == 0
                             )) {
                            iVar3._M_node[5].field_0x4 = 0;
                          }
                          else {
                            iVar3._M_node[5].field_0x4 = 1;
                          }
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)&sStack_388);
                          if (iVar2 == 0) {
                            iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8);
                            if ((iVar2 == 0) ||
                               (iVar2 = std::__cxx11::string::compare((char *)&sStack_3c8),
                               iVar2 == 0)) {
                              iVar3._M_node[5].field_0x5 = 0;
                            }
                            else {
                              iVar3._M_node[5].field_0x5 = 1;
                            }
                          }
                          else {
                            iVar2 = std::__cxx11::string::compare((char *)&sStack_388);
                            if (iVar2 == 0) {
                              iVar2 = atoi(sStack_3c8._M_dataplus._M_p);
                              *(int *)&iVar3._M_node[5]._M_parent = iVar2;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            memset(acStack_230,0,500);
            pcVar10 = fgets(acStack_230,499,__stream);
          } while (pcVar10 != (char *)0x0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_3c8._M_dataplus._M_p != &sStack_3c8.field_2) {
          operator_delete(sStack_3c8._M_dataplus._M_p,
                          CONCAT71(sStack_3c8.field_2._M_allocated_capacity._1_7_,
                                   sStack_3c8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_388._M_dataplus._M_p != &sStack_388.field_2) {
          operator_delete(sStack_388._M_dataplus._M_p,
                          CONCAT71(sStack_388.field_2._M_allocated_capacity._1_7_,
                                   sStack_388.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_3e8._M_dataplus._M_p != &sStack_3e8.field_2) {
          operator_delete(sStack_3e8._M_dataplus._M_p,
                          CONCAT71(sStack_3e8.field_2._M_allocated_capacity._1_7_,
                                   sStack_3e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)kStack_3a8._M_dataplus._M_p != &kStack_3a8.field_2) {
          operator_delete(kStack_3a8._M_dataplus._M_p,
                          CONCAT71(kStack_3a8.field_2._M_allocated_capacity._1_7_,
                                   kStack_3a8.field_2._M_local_buf[0]) + 1);
        }
        fclose(__stream);
      }
      return;
    }
    if (pcVar10[(long)this] != '/') {
      std::__cxx11::string::append((char *)path);
      return;
    }
  }
  return;
}

Assistant:

void FixPath(std::string &path)
{
	if (path.empty())
	{
		return;
	}
	for (std::string::iterator iter = path.begin(); iter != path.end(); ++iter)
	{
		if (*iter == '\\')
		{
			*iter = '/';
		}
	}
	if (path.at(path.length()-1) != '/')
	{
		path += "/";
	}
}